

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glist.c
# Opt level: O2

glist_t glist_reverse(glist_t g)

{
  gnode_s *pgVar1;
  glist_t pgVar2;
  gnode_t *gn;
  
  pgVar2 = (glist_t)0x0;
  while (g != (glist_t)0x0) {
    pgVar1 = g->next;
    g->next = pgVar2;
    pgVar2 = g;
    g = pgVar1;
  }
  return pgVar2;
}

Assistant:

glist_t
glist_reverse(glist_t g)
{
    gnode_t *gn, *nextgn;
    gnode_t *rev;

    rev = NULL;
    for (gn = g; gn; gn = nextgn) {
        nextgn = gn->next;

        gn->next = rev;
        rev = gn;
    }

    return rev;
}